

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSplitter.h
# Opt level: O0

LineSplitter * __thiscall Assimp::LineSplitter::operator++(LineSplitter *this)

{
  bool bVar1;
  int8_t iVar2;
  uint uVar3;
  logic_error *this_00;
  bool local_3d;
  char s;
  LineSplitter *this_local;
  
  if ((this->mSwallow & 1U) == 0) {
    bVar1 = operator_cast_to_bool(this);
    if (!bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"End of file, no more lines to be retrieved.");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::__cxx11::string::clear();
    while (uVar3 = StreamReader<false,_false>::GetRemainingSize(this->mStream), uVar3 != 0) {
      iVar2 = StreamReader<false,_false>::GetI1(this->mStream);
      if ((iVar2 == '\n') || (iVar2 == '\r')) {
        if ((this->mSkip_empty_lines & 1U) == 0) {
          uVar3 = StreamReader<false,_false>::GetRemainingSize(this->mStream);
          if (((uVar3 != 0) && (iVar2 == '\r')) &&
             (iVar2 = StreamReader<false,_false>::GetI1(this->mStream), iVar2 != '\n')) {
            StreamReader<false,_false>::IncPtr(this->mStream,-1);
          }
          if ((this->mTrim & 1U) != 0) {
            do {
              uVar3 = StreamReader<false,_false>::GetRemainingSize(this->mStream);
              local_3d = false;
              if (uVar3 != 0) {
                iVar2 = StreamReader<false,_false>::GetI1(this->mStream);
                local_3d = iVar2 == ' ' || iVar2 == '\t';
              }
            } while (local_3d);
            uVar3 = StreamReader<false,_false>::GetRemainingSize(this->mStream);
            if (uVar3 != 0) {
              StreamReader<false,_false>::IncPtr(this->mStream,-1);
            }
          }
        }
        else {
          do {
            uVar3 = StreamReader<false,_false>::GetRemainingSize(this->mStream);
            bVar1 = false;
            if (uVar3 != 0) {
              iVar2 = StreamReader<false,_false>::GetI1(this->mStream);
              bVar1 = true;
              if ((iVar2 != ' ') && (bVar1 = true, iVar2 != '\r')) {
                bVar1 = iVar2 == '\n';
              }
            }
          } while (bVar1);
          uVar3 = StreamReader<false,_false>::GetRemainingSize(this->mStream);
          if (uVar3 != 0) {
            StreamReader<false,_false>::IncPtr(this->mStream,-1);
          }
        }
        break;
      }
      std::__cxx11::string::operator+=((string *)&this->mCur,iVar2);
    }
    this->mIdx = this->mIdx + 1;
  }
  else {
    this->mSwallow = false;
  }
  return this;
}

Assistant:

AI_FORCE_INLINE
LineSplitter& LineSplitter::operator++() {
    if (mSwallow) {
        mSwallow = false;
        return *this;
    }

    if (!*this) {
        throw std::logic_error("End of file, no more lines to be retrieved.");
    }

    char s;
    mCur.clear();
    while (mStream.GetRemainingSize() && (s = mStream.GetI1(), 1)) {
        if (s == '\n' || s == '\r') {
            if (mSkip_empty_lines) {
                while (mStream.GetRemainingSize() && ((s = mStream.GetI1()) == ' ' || s == '\r' || s == '\n'));
                if (mStream.GetRemainingSize()) {
                    mStream.IncPtr(-1);
                }
            } else {
                // skip both potential line terminators but don't read past this line.
                if (mStream.GetRemainingSize() && (s == '\r' && mStream.GetI1() != '\n')) {
                    mStream.IncPtr(-1);
                }
                if (mTrim) {
                    while (mStream.GetRemainingSize() && ((s = mStream.GetI1()) == ' ' || s == '\t'));
                    if (mStream.GetRemainingSize()) {
                        mStream.IncPtr(-1);
                    }
                }
            }
            break;
        }
        mCur += s;
    }
    ++mIdx;

    return *this;
}